

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O0

void __thiscall
UKF::PredictRadarMeasurement
          (UKF *this,MatrixXd *Xsig_pred,MatrixXd *Zsig,VectorXd *z_pred,MatrixXd *S)

{
  MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this_00;
  MatrixXd *this_01;
  Index IVar1;
  CoeffReturnType pdVar2;
  Scalar *pSVar3;
  Scalar *pSVar4;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_380;
  double local_368;
  Scalar local_360;
  Scalar local_358;
  Scalar local_350;
  double local_348;
  Scalar local_340;
  Scalar local_338;
  Scalar local_330;
  double local_328;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_320;
  undefined1 local_300 [8];
  MatrixXd R;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_2e0;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>
  local_2b0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
  local_278;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>> local_220 [56];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_1e8;
  undefined1 local_1a0 [8];
  VectorXd z_diff;
  Scalar SStack_188;
  int i_2;
  ColXpr local_180;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_148;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
  local_e8;
  int local_74;
  Scalar SStack_70;
  int i_1;
  double local_68;
  double v2;
  double v1;
  double yaw;
  double v;
  double py;
  double px;
  int i;
  int n_z;
  MatrixXd *S_local;
  VectorXd *z_pred_local;
  MatrixXd *Zsig_local;
  MatrixXd *Xsig_pred_local;
  UKF *this_local;
  
  _i = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)S;
  S_local = (MatrixXd *)z_pred;
  z_pred_local = (VectorXd *)Zsig;
  Zsig_local = Xsig_pred;
  Xsig_pred_local = (MatrixXd *)this;
  IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
                    (&z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>);
  px._4_4_ = (undefined4)IVar1;
  for (px._0_4_ = 0; px._0_4_ < this->n_sigma_; px._0_4_ = px._0_4_ + 1) {
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)Zsig_local,0
                        ,(long)px._0_4_);
    py = *pdVar2;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)Zsig_local,1
                        ,(long)px._0_4_);
    v = *pdVar2;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)Zsig_local,2
                        ,(long)px._0_4_);
    yaw = *pdVar2;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)Zsig_local,3
                        ,(long)px._0_4_);
    v1 = *pdVar2;
    dVar6 = cos(v1);
    v2 = dVar6 * yaw;
    local_68 = sin(v1);
    local_68 = local_68 * yaw;
    dVar6 = sqrt(py * py + v * v);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)z_pred_local
                        ,0,(long)px._0_4_);
    *pSVar3 = dVar6;
    dVar6 = atan2(v,py);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)z_pred_local
                        ,1,(long)px._0_4_);
    *pSVar3 = dVar6;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)z_pred_local
                        ,0,(long)px._0_4_);
    if ((*pSVar3 != 0.0) || (NAN(*pSVar3))) {
      dVar8 = v * local_68;
      dVar7 = py * v2;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          z_pred_local,0,(long)px._0_4_);
      dVar6 = *pSVar3;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          z_pred_local,2,(long)px._0_4_);
      *pSVar3 = (dVar7 + dVar8) / dVar6;
    }
    else {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          z_pred_local,2,(long)px._0_4_);
      *pSVar3 = 0.0;
    }
  }
  SStack_70 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::fill
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)S_local,&stack0xffffffffffffff90)
  ;
  for (local_74 = 0; this_01 = S_local, local_74 < this->n_sigma_; local_74 = local_74 + 1) {
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        &this->weights_,(long)local_74);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (&local_180,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)z_pred_local,
               (long)local_74);
    Eigen::operator*(&local_148,pSVar4,(StorageBaseType *)&local_180);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              (&local_e8,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this_01,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                *)&local_148);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,_1,1,0,_1,1> *)S_local,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>_>
                *)&local_e8);
  }
  SStack_188 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::fill(_i,&stack0xfffffffffffffe78);
  for (z_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_
            = 0;
      z_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ <
      this->n_sigma_;
      z_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
           z_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
           _4_4_ + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              ((ColXpr *)local_220,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)z_pred_local,
               (long)z_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                     .m_rows._4_4_);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::operator-
              (&local_1e8,local_220,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)S_local);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((Matrix<double,_1,1,0,_1,1> *)local_1a0,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_1e8);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1a0,1);
    dVar6 = normalizeRadiansPiToMinusPi<double>(*pSVar4);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1a0,1);
    this_00 = (MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)_i;
    *pSVar4 = dVar6;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        &this->weights_,
                        (long)z_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows._4_4_);
    Eigen::operator*(&local_2e0,pSVar4,(StorageBaseType *)local_1a0);
    R.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
         (Index)Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1a0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
    ::operator*(&local_2b0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                 *)&local_2e0,
                (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
                &R.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
               );
    Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+
              (&local_278,this_00,
               (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
                *)&local_2b0);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
              ((Matrix<double,_1,_1,0,_1,_1> *)_i,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>_>
                *)&local_278);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_1a0);
  }
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_300,(int *)((long)&px + 4),(int *)((long)&px + 4)
            );
  local_328 = this->std_radr_ * this->std_radr_;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
            (&local_320,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_300,&local_328
            );
  local_330 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_320,&local_330);
  local_338 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_338);
  local_340 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_340);
  local_348 = this->std_radphi_ * this->std_radphi_;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_348);
  local_350 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_350);
  local_358 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_358);
  local_360 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_360);
  local_368 = this->std_radrd_ * this->std_radrd_;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar5,&local_368);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_320);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+
            (&local_380,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)_i,
             (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_300);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,_1,_1,0,_1,_1> *)_i,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_380);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_300);
  return;
}

Assistant:

void UKF::PredictRadarMeasurement(const MatrixXd &Xsig_pred, MatrixXd &Zsig, VectorXd &z_pred, MatrixXd &S) {

  //set measurement dimension, radar can measure r, phi, and r_dot
  int n_z = z_pred.rows();

  // transform sigma points into measurement space

  for (int i = 0; i < n_sigma_; i++) {

    // extract values for better readability
    double px  = Xsig_pred(0, i);
    double py  = Xsig_pred(1, i);
    double v   = Xsig_pred(2, i);
    double yaw = Xsig_pred(3, i);

    double v1 = cos(yaw) * v;
    double v2 = sin(yaw) * v;

    // measurement model
    Zsig(0, i) = sqrt(px*px + py*py);                  // r
    Zsig(1, i) = atan2(py, px);                        //phi
    if (Zsig(0, i) != 0) {
      Zsig(2, i) = (px * v1 + py * v2) / Zsig(0, i);   //r_dot
    } else {
      Zsig(2, i) = 0;
    }
  }

  // mean predicted measurement
  z_pred.fill(0.0);
  for (int i=0; i < n_sigma_; i++) {
    z_pred = z_pred + weights_(i) * Zsig.col(i);
  }

  // measurement covariance matrix S
  S.fill(0.0);
  for (int i=0; i < n_sigma_; i++) {
    // residual
    VectorXd z_diff = Zsig.col(i) - z_pred;
    z_diff(1) = normalizeRadiansPiToMinusPi(z_diff(1));

    S = S + weights_(i) * z_diff * z_diff.transpose();
  }

  // add measurement noise covariance matrix to the measurement covariance matrix
  MatrixXd R = MatrixXd(n_z, n_z);
  R <<    std_radr_*std_radr_, 0,                       0,
          0,                   std_radphi_*std_radphi_, 0,
          0,                   0,                       std_radrd_*std_radrd_;

  S = S + R;
}